

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm_vecsmall::SmallVectorTemplateBase<Command::Arg,_false>::grow
          (SmallVectorTemplateBase<Command::Arg,_false> *this,size_t MinSize)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 *__ptr;
  ulong uVar6;
  void *pvVar7;
  long lVar8;
  
  puVar2 = (undefined4 *)
           (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.BeginX;
  puVar3 = (undefined4 *)
           (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.EndX;
  uVar6 = ((long)(this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.
                 CapacityX - (long)puVar2 >> 5) + 2;
  uVar6 = uVar6 >> 1 | uVar6;
  uVar6 = uVar6 >> 2 | uVar6;
  uVar6 = uVar6 >> 4 | uVar6;
  uVar6 = uVar6 >> 8 | uVar6;
  uVar6 = uVar6 >> 0x10 | uVar6;
  uVar6 = (uVar6 >> 0x20 | uVar6) + 1;
  if (uVar6 <= MinSize) {
    uVar6 = MinSize;
  }
  pvVar7 = malloc(uVar6 * 0x20);
  if (puVar2 != puVar3) {
    lVar8 = 0;
    do {
      puVar1 = (undefined4 *)(lVar8 + (long)puVar2);
      *(undefined2 *)((long)pvVar7 + lVar8 + 4) = *(undefined2 *)(puVar1 + 1);
      *(undefined4 *)((long)pvVar7 + lVar8) = *puVar1;
      *(undefined8 *)((long)pvVar7 + lVar8 + 8) = *(undefined8 *)(puVar1 + 2);
      *(undefined8 *)((long)pvVar7 + lVar8 + 0x10) = *(undefined8 *)(puVar1 + 4);
      *(undefined8 *)((long)pvVar7 + lVar8 + 0x18) = *(undefined8 *)(puVar1 + 6);
      *(undefined8 *)(puVar1 + 2) = 0;
      *(undefined8 *)(puVar1 + 4) = 0;
      *(undefined8 *)(puVar1 + 6) = 0;
      lVar8 = lVar8 + 0x20;
    } while (puVar1 + 8 != puVar3);
  }
  pvVar4 = (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.BeginX;
  for (pvVar5 = (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.
                EndX; pvVar5 != pvVar4; pvVar5 = (void *)((long)pvVar5 + -0x20)) {
    std::vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_>::~vector
              ((vector<std::shared_ptr<Enum>,_std::allocator<std::shared_ptr<Enum>_>_> *)
               ((long)pvVar5 + -0x18));
  }
  __ptr = (undefined1 *)
          (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.BeginX;
  if ((U *)__ptr != &(this->super_SmallVectorTemplateCommon<Command::Arg,_void>).FirstEl) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.EndX =
       (void *)(((long)puVar3 - (long)puVar2) + (long)pvVar7);
  (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.BeginX = pvVar7;
  (this->super_SmallVectorTemplateCommon<Command::Arg,_void>).super_SmallVectorBase.CapacityX =
       (void *)(uVar6 * 0x20 + (long)pvVar7);
  return;
}

Assistant:

void SmallVectorTemplateBase<T, isPodLike>::grow(size_t MinSize) {
  size_t CurCapacity = this->capacity();
  size_t CurSize = this->size();
  // Always grow, even from zero.
  size_t NewCapacity = size_t(llvm_vecsmall::detail::NextPowerOf2(CurCapacity+2));
  if (NewCapacity < MinSize)
    NewCapacity = MinSize;
  T *NewElts = static_cast<T*>(malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->setEnd(NewElts+CurSize);
  this->BeginX = NewElts;
  this->CapacityX = this->begin()+NewCapacity;
}